

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void vli_modMult_n(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right)

{
  uECC_word_t uVar1;
  uECC_word_t uVar2;
  wordcount_t i_1;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uECC_word_t *puVar6;
  wordcount_t i;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uECC_word_t local_f8;
  uECC_word_t product [8];
  uECC_word_t tmp [8];
  uECC_word_t modMultiple [8];
  uECC_word_t *v [2];
  
  modMultiple[7] = (uECC_word_t)(product + 7);
  vli_mult(&local_f8,left,right);
  modMultiple[5] = 0xffffffffffffffff;
  modMultiple[6] = 0xffffffff00000000;
  modMultiple[3] = 0xf3b9cac2fc632551;
  modMultiple[4] = 0xbce6faada7179e84;
  tmp[7] = 0;
  modMultiple[0] = 0;
  modMultiple[1] = 0;
  modMultiple[2] = 0;
  uVar3 = 1;
  iVar4 = 0;
  do {
    uVar1 = modMultiple[(uVar3 ^ 1) + 7];
    uVar2 = modMultiple[uVar3 + 7];
    lVar7 = 0;
    uVar8 = 0;
    do {
      uVar9 = *(ulong *)(uVar2 + lVar7 * 8);
      uVar10 = tmp[lVar7 + 7] + uVar8;
      uVar5 = (ulong)(uVar9 < uVar10);
      if (uVar10 == 0) {
        uVar5 = uVar8;
      }
      *(ulong *)(uVar1 + lVar7 * 8) = uVar9 - uVar10;
      lVar7 = lVar7 + 1;
      uVar8 = uVar5;
    } while (lVar7 != 8);
    uVar8 = 0;
    puVar6 = modMultiple + 3;
    do {
      uVar9 = puVar6[-1];
      puVar6[-1] = uVar9 >> 1 | uVar8;
      puVar6 = puVar6 + -1;
      uVar8 = uVar9 << 0x3f;
    } while (tmp + 7 < puVar6);
    modMultiple[2] = modMultiple[2] | modMultiple[3] << 0x3f;
    uVar8 = 0x48;
    uVar9 = 0;
    do {
      uVar10 = *(ulong *)((long)tmp + uVar8 + 0x28);
      *(ulong *)((long)tmp + uVar8 + 0x28) = uVar10 >> 1 | uVar9;
      uVar9 = uVar10 << 0x3f;
      uVar8 = uVar8 - 8;
    } while (0x28 < uVar8);
    uVar3 = (ulong)(uVar3 == uVar5);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x101);
  uVar1 = modMultiple[uVar3 + 7];
  lVar7 = 0;
  do {
    result[lVar7] = *(uECC_word_t *)(uVar1 + lVar7 * 8);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  return;
}

Assistant:

static void vli_modMult_n(uECC_word_t *result, const uECC_word_t *left, const uECC_word_t *right) {
    uECC_word_t product[2 * uECC_WORDS];
    uECC_word_t modMultiple[2 * uECC_WORDS];
    uECC_word_t tmp[2 * uECC_WORDS];
    uECC_word_t *v[2] = {tmp, product};
    bitcount_t i;
    uECC_word_t index = 1;

    vli_mult(product, left, right);
    vli_set(modMultiple + uECC_WORDS, curve_n); /* works if curve_n has its highest bit set */
    vli_clear(modMultiple);

    for (i = 0; i <= uECC_BYTES * 8; ++i) {
        uECC_word_t borrow = vli2_sub(v[1 - index], v[index], modMultiple);
        index = !(index ^ borrow); /* Swap the index if there was no borrow */
        vli2_rshift1(modMultiple);
    }
    vli_set(result, v[index]);
}